

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O0

int CheckCompress(size_t expectedLength)

{
  int iVar1;
  FILE *__stream;
  FILE *out;
  size_t expectedLength_local;
  
  __stream = fopen("out.txt","rb");
  if (__stream == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    TestN = TestN + 1;
    expectedLength_local._4_4_ = -1;
  }
  else if ((uchar *)(expectedLength + 1) < Input + 0x1ef8c92) {
    LabOutputLength = fread(LabOutput,1,expectedLength + 1,__stream);
    fclose(__stream);
    iVar1 = CheckAtMost((int)LabOutputLength,(int)expectedLength);
    if (iVar1 == 0) {
      printf("FAILED\n");
      TestN = TestN + 1;
      expectedLength_local._4_4_ = 1;
    }
    else {
      printf("PASSED\n");
      TestN = TestN + 1;
      expectedLength_local._4_4_ = 0;
    }
  }
  else {
    printf("Tester error: expected output is too large");
    expectedLength_local._4_4_ = -1;
  }
  return expectedLength_local._4_4_;
}

Assistant:

static int CheckCompress(size_t expectedLength) {
    FILE *const out = fopen("out.txt", "rb");
    if (!out) {
        printf("can't open out.txt\n");
        TestN++;
        return -1;
    }
    if (expectedLength+1 > sizeof(LabOutput)) {
        printf("Tester error: expected output is too large");
        return -1;
    }
    LabOutputLength = fread(LabOutput, 1, expectedLength+1, out);
    fclose(out);
    if (CheckAtMost(LabOutputLength, expectedLength)) {
        printf("PASSED\n");
        TestN++;
        return 0;
    } else {
        printf("FAILED\n");
        TestN++;
        return 1;
    }
}